

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O0

__pid_t __thiscall pcplusplus::threads::generic_threads::fork(generic_threads *this)

{
  __pid_t extraout_EAX;
  system_error *e;
  size_t i;
  thread *in_stack_ffffffffffffff58;
  type in_stack_ffffffffffffff60;
  generic_threads **in_stack_ffffffffffffff90;
  type *in_stack_ffffffffffffff98;
  thread *in_stack_ffffffffffffffa0;
  ulong local_10;
  
  lock((generic_threads *)0x104bd1);
  for (local_10 = 0; local_10 < this->num_threads; local_10 = local_10 + 1) {
    std::thread::
    thread<void(pcplusplus::threads::generic_threads::*)(),pcplusplus::threads::generic_threads*,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff60 =
         std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::operator[]
                   ((unique_ptr<std::thread[],_std::default_delete<std::thread[]>_> *)
                    in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    std::thread::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::thread::~thread((thread *)0x104c6e);
  }
  unlock((generic_threads *)0x104db3);
  return extraout_EAX;
}

Assistant:

virtual inline void fork(){
		lock();
		try{
		    for(size_t i = 0; i < num_threads; ++i)
			threads[i] = std::thread(&generic_threads::thread_routine, this);
		}
		catch(const std::system_error& e){
		    throw exceptions::thread_failure("Failed to fork a " + thread_type + " thread.");
		}
		unlock();
	    }